

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mark.hpp
# Opt level: O0

Mark * __thiscall bm::Mark::average(Mark *__return_storage_ptr__,Mark *this)

{
  duration<unsigned_long,_std::ratio<1L,_1000000000L>_> local_58 [3];
  byte local_39;
  function<void_(const_bm::Mark_&)> local_38;
  Mark *local_18;
  Mark *this_local;
  
  local_39 = 0;
  local_18 = this;
  this_local = __return_storage_ptr__;
  if (this->_iterations == 0) {
    std::function<void_(const_bm::Mark_&)>::function(&local_38,(nullptr_t)0x0);
    local_39 = 1;
    Mark(__return_storage_ptr__,&local_38);
  }
  else {
    local_58[0] = std::chrono::operator/(&this->_total,&this->_iterations);
    Mark<unsigned_long,std::ratio<1l,1000000000l>>(__return_storage_ptr__,local_58);
  }
  if ((local_39 & 1) != 0) {
    std::function<void_(const_bm::Mark_&)>::~function(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Mark average() const
    {
        return (_iterations == 0) ? Mark() : Mark(_total/_iterations);
    }